

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_map_format.hpp
# Opt level: O0

uint32_t PatchNewMapFormat::inject_func_load_data_block(ROM *rom)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  size_t this;
  uint32_t uVar1;
  allocator<char> local_c59;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  DataRegister local_c10;
  DataRegister local_c00;
  DataRegister local_bf0;
  DataRegister local_be0;
  AddressRegister local_bd0;
  AddressInRegister local_bc0;
  DataRegister local_ba0;
  DataRegister local_b90;
  DataRegister local_b80;
  DataRegister local_b70;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  DataRegister local_b10;
  Register local_b00;
  DataRegister local_af0;
  DataRegister local_ae0;
  DataRegister local_ad0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  DataRegister local_a70;
  DataRegister local_a60;
  Register local_a50;
  DataRegister local_a40;
  DataRegister local_a30;
  DataRegister local_a20;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  DataRegister local_9c0;
  AddressRegister local_9b0;
  AddressInRegister local_9a0;
  DataRegister local_980;
  DataRegister local_970;
  allocator<char> local_959;
  string local_958;
  allocator<char> local_931;
  string local_930;
  DataRegister local_910;
  DataRegister local_900;
  DataRegister local_8f0;
  DataRegister local_8e0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  DataRegister local_880;
  DataRegister local_870;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  DataRegister local_7e8;
  allocator<char> local_7d1;
  string local_7d0;
  DataRegister local_7b0;
  allocator<char> local_799;
  string local_798;
  DataRegister local_778;
  allocator<char> local_761;
  string local_760;
  DataRegister local_740;
  allocator<char> local_729;
  string local_728;
  DataRegister local_708;
  DataRegister local_6f8;
  DataRegister local_6e8;
  DataRegister local_6d8;
  DataRegister local_6c8;
  DataRegister local_6b8;
  allocator<char> local_6a1;
  string local_6a0;
  DataRegister local_680;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  AddressRegister local_620;
  AddressInRegister local_610;
  DataRegister local_5f0;
  Register local_5e0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  Register local_580;
  Register local_570;
  allocator<char> local_559;
  string local_558;
  allocator<md::AddressRegister> local_531;
  AddressRegister local_530;
  iterator local_520;
  size_type local_518;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_510;
  allocator<md::DataRegister> local_4f1;
  DataRegister local_4f0;
  DataRegister local_4e0;
  DataRegister local_4d0;
  DataRegister local_4c0;
  DataRegister local_4b0;
  DataRegister local_4a0;
  DataRegister local_490;
  DataRegister local_480;
  iterator local_470;
  size_type local_468;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_460;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  AddressRegister local_3f8;
  AddressRegister local_3e8;
  AddressRegister local_3d8;
  allocator<char> local_3c1;
  string local_3c0;
  DataRegister local_3a0;
  allocator<char> local_389;
  string local_388;
  AddressRegister local_368;
  AddressInRegister local_358;
  DataRegister local_338;
  allocator<char> local_321;
  string local_320;
  DataRegister local_300;
  AddressRegister local_2f0;
  AddressInRegister local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  DataRegister local_298;
  allocator<char> local_281;
  string local_280;
  DataRegister local_260;
  allocator<char> local_249;
  string local_248;
  DataRegister local_228;
  DataRegister local_218;
  AddressRegister local_208;
  DataRegister local_1f8;
  AddressRegister local_1e8;
  AddressRegister local_1d8;
  allocator<char> local_1c1;
  string local_1c0;
  AddressRegister local_1a0;
  DataRegister local_190;
  allocator<md::AddressRegister> local_179;
  AddressRegister local_178;
  iterator local_168;
  size_type local_160;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_158;
  allocator<md::DataRegister> local_13d [13];
  DataRegister local_130;
  DataRegister local_120;
  DataRegister local_110;
  DataRegister local_100;
  DataRegister local_f0;
  DataRegister local_e0;
  DataRegister local_d0;
  DataRegister local_c0;
  iterator local_b0;
  size_type local_a8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a0;
  undefined1 local_88 [8];
  Code func;
  ROM *rom_local;
  
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::DataRegister::DataRegister(&local_130,'\0');
  md::DataRegister::DataRegister(&local_120,'\x01');
  md::DataRegister::DataRegister(&local_110,'\x02');
  md::DataRegister::DataRegister(&local_100,'\x03');
  md::DataRegister::DataRegister(&local_f0,'\x04');
  md::DataRegister::DataRegister(&local_e0,'\x05');
  md::DataRegister::DataRegister(&local_d0,'\x06');
  md::DataRegister::DataRegister(&local_c0,'\a');
  local_b0 = &local_130;
  local_a8 = 8;
  std::allocator<md::DataRegister>::allocator(local_13d);
  __l_02._M_len = local_a8;
  __l_02._M_array = local_b0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a0,__l_02,local_13d);
  md::AddressRegister::AddressRegister(&local_178,'\x03');
  local_168 = &local_178;
  local_160 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_179);
  __l_01._M_len = local_160;
  __l_01._M_array = local_168;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_158,__l_01,&local_179);
  md::Code::movem_to_stack((Code *)local_88,&local_a0,&local_158);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_158);
  std::allocator<md::AddressRegister>::~allocator(&local_179);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a0);
  std::allocator<md::DataRegister>::~allocator(local_13d);
  md::DataRegister::DataRegister(&local_190,'\x01');
  md::AddressRegister::AddressRegister(&local_1a0,'\x01');
  md::Code::adda((Code *)local_88,(Param *)&local_190,&local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"line",&local_1c1);
  md::Code::label((Code *)local_88,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  md::AddressRegister::AddressRegister(&local_1d8,'\x01');
  md::AddressRegister::AddressRegister(&local_1e8,'\x03');
  md::Code::movel((Code *)local_88,(Param *)&local_1d8,(Param *)&local_1e8);
  md::DataRegister::DataRegister(&local_1f8,'\x02');
  md::AddressRegister::AddressRegister(&local_208,'\x01');
  md::Code::adda((Code *)local_88,(Param *)&local_1f8,&local_208);
  md::DataRegister::DataRegister(&local_218,'\x03');
  md::DataRegister::DataRegister(&local_228,'\0');
  md::Code::movew((Code *)local_88,(Param *)&local_218,(Param *)&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"loop",&local_249);
  md::Code::label((Code *)local_88,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  md::DataRegister::DataRegister(&local_260,'\x05');
  md::Code::tstw((Code *)local_88,(Param *)&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"skip",&local_281);
  md::Code::bne((Code *)local_88,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  md::DataRegister::DataRegister(&local_298,'\x04');
  md::Code::tstw((Code *)local_88,(Param *)&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"repeat",&local_2b9);
  md::Code::bne((Code *)local_88,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  md::AddressRegister::AddressRegister(&local_2f0,'\0');
  addr_postinc_<void>(&local_2e0,&local_2f0);
  md::DataRegister::DataRegister(&local_300,'\a');
  md::Code::movew((Code *)local_88,&local_2e0.super_Param,(Param *)&local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"minus_case",&local_321);
  md::Code::bmi((Code *)local_88,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  md::DataRegister::DataRegister(&local_338,'\a');
  md::AddressRegister::AddressRegister(&local_368,'\x01');
  addr_postinc_<void>(&local_358,&local_368);
  md::Code::movew((Code *)local_88,(Param *)&local_338,&local_358.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"next_loop_iteration",&local_389);
  md::Code::label((Code *)local_88,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  md::DataRegister::DataRegister(&local_3a0,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"loop",&local_3c1);
  md::Code::dbra((Code *)local_88,&local_3a0,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  md::AddressRegister::AddressRegister(&local_3d8,'\x03');
  md::AddressRegister::AddressRegister(&local_3e8,'\x01');
  md::Code::movel((Code *)local_88,(Param *)&local_3d8,(Param *)&local_3e8);
  md::AddressRegister::AddressRegister(&local_3f8,'\x01');
  md::Code::adda((Code *)local_88,0x94,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"line",&local_419);
  md::Code::bra((Code *)local_88,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"ret",&local_441);
  md::Code::label((Code *)local_88,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  md::DataRegister::DataRegister(&local_4f0,'\0');
  md::DataRegister::DataRegister(&local_4e0,'\x01');
  md::DataRegister::DataRegister(&local_4d0,'\x02');
  md::DataRegister::DataRegister(&local_4c0,'\x03');
  md::DataRegister::DataRegister(&local_4b0,'\x04');
  md::DataRegister::DataRegister(&local_4a0,'\x05');
  md::DataRegister::DataRegister(&local_490,'\x06');
  md::DataRegister::DataRegister(&local_480,'\a');
  local_470 = &local_4f0;
  local_468 = 8;
  std::allocator<md::DataRegister>::allocator(&local_4f1);
  __l_00._M_len = local_468;
  __l_00._M_array = local_470;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_460,__l_00,&local_4f1);
  md::AddressRegister::AddressRegister(&local_530,'\x03');
  local_520 = &local_530;
  local_518 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_531);
  __l._M_len = local_518;
  __l._M_array = local_520;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_510,__l,&local_531);
  md::Code::movem_from_stack((Code *)local_88,&local_460,&local_510);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_510);
  std::allocator<md::AddressRegister>::~allocator(&local_531);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_460);
  std::allocator<md::DataRegister>::~allocator(&local_4f1);
  md::Code::rts((Code *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"skip",&local_559);
  md::Code::label((Code *)local_88,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  md::DataRegister::DataRegister((DataRegister *)&local_570,'\x05');
  md::Code::subqw((Code *)local_88,'\x01',&local_570);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_580,'\x01');
  md::Code::addql((Code *)local_88,'\x02',&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"next_loop_iteration",&local_5a1);
  md::Code::bra((Code *)local_88,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"repeat",&local_5c9);
  md::Code::label((Code *)local_88,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  md::DataRegister::DataRegister((DataRegister *)&local_5e0,'\x04');
  md::Code::subqw((Code *)local_88,'\x01',&local_5e0);
  md::DataRegister::DataRegister(&local_5f0,'\x06');
  md::AddressRegister::AddressRegister(&local_620,'\x01');
  addr_postinc_<void>(&local_610,&local_620);
  md::Code::movew((Code *)local_88,(Param *)&local_5f0,&local_610.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"next_loop_iteration",&local_641);
  md::Code::bra((Code *)local_88,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"minus_case",&local_669);
  md::Code::label((Code *)local_88,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  md::DataRegister::DataRegister(&local_680,'\a');
  md::Code::andiw((Code *)local_88,0x7fff,(Param *)&local_680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"ret",&local_6a1);
  md::Code::beq((Code *)local_88,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  md::DataRegister::DataRegister(&local_6b8,'\a');
  md::DataRegister::DataRegister(&local_6c8,'\x06');
  md::Code::movew((Code *)local_88,(Param *)&local_6b8,(Param *)&local_6c8);
  md::DataRegister::DataRegister(&local_6d8,'\x06');
  md::Code::andiw((Code *)local_88,0xfff,(Param *)&local_6d8);
  md::DataRegister::DataRegister(&local_6e8,'\a');
  md::Code::lsll((Code *)local_88,'\x04',&local_6e8);
  md::DataRegister::DataRegister(&local_6f8,'\a');
  md::Code::clrw((Code *)local_88,(Param *)&local_6f8);
  md::DataRegister::DataRegister(&local_708,'\a');
  md::Code::swap((Code *)local_88,&local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"init_skip",&local_729);
  md::Code::beq((Code *)local_88,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  md::DataRegister::DataRegister(&local_740,'\a');
  md::Code::cmpib((Code *)local_88,'\x02',(Param *)&local_740);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"init_repeat_byte",&local_761);
  md::Code::beq((Code *)local_88,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  md::DataRegister::DataRegister(&local_778,'\a');
  md::Code::cmpib((Code *)local_88,'\x01',(Param *)&local_778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"unpack_bytes",&local_799)
  ;
  md::Code::beq((Code *)local_88,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  md::DataRegister::DataRegister(&local_7b0,'\a');
  md::Code::cmpib((Code *)local_88,'\x05',(Param *)&local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"init_repeat_inverted_word",&local_7d1);
  md::Code::beq((Code *)local_88,&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  md::DataRegister::DataRegister(&local_7e8,'\a');
  md::Code::cmpib((Code *)local_88,'\x06',(Param *)&local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"init_repeat_small_word",&local_809);
  md::Code::beq((Code *)local_88,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"init_repeat_word",&local_831);
  md::Code::bra((Code *)local_88,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"init_skip",&local_859);
  md::Code::label((Code *)local_88,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  md::DataRegister::DataRegister(&local_870,'\x06');
  md::DataRegister::DataRegister(&local_880,'\x05');
  md::Code::movew((Code *)local_88,(Param *)&local_870,(Param *)&local_880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"skip",&local_8a1);
  md::Code::bra((Code *)local_88,&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"init_repeat_byte",&local_8c9);
  md::Code::label((Code *)local_88,&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  md::DataRegister::DataRegister(&local_8e0,'\x06');
  md::DataRegister::DataRegister(&local_8f0,'\x04');
  md::Code::movew((Code *)local_88,(Param *)&local_8e0,(Param *)&local_8f0);
  md::DataRegister::DataRegister(&local_900,'\x04');
  md::Code::lsrw((Code *)local_88,'\b',&local_900);
  md::DataRegister::DataRegister(&local_910,'\x06');
  md::Code::andiw((Code *)local_88,0xff,(Param *)&local_910);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"repeat",&local_931);
  md::Code::bra((Code *)local_88,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"init_repeat_word",&local_959);
  md::Code::label((Code *)local_88,&local_958);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  md::DataRegister::DataRegister(&local_970,'\x06');
  md::DataRegister::DataRegister(&local_980,'\x04');
  md::Code::movew((Code *)local_88,(Param *)&local_970,(Param *)&local_980);
  md::AddressRegister::AddressRegister(&local_9b0,'\0');
  addr_postinc_<void>(&local_9a0,&local_9b0);
  md::DataRegister::DataRegister(&local_9c0,'\x06');
  md::Code::movew((Code *)local_88,&local_9a0.super_Param,(Param *)&local_9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"repeat",&local_9e1);
  md::Code::bra((Code *)local_88,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"init_repeat_inverted_word",&local_a09);
  md::Code::label((Code *)local_88,&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  md::DataRegister::DataRegister(&local_a20,'\x06');
  md::DataRegister::DataRegister(&local_a30,'\x04');
  md::Code::movew((Code *)local_88,(Param *)&local_a20,(Param *)&local_a30);
  md::DataRegister::DataRegister(&local_a40,'\x04');
  md::Code::andiw((Code *)local_88,0xf,(Param *)&local_a40);
  md::DataRegister::DataRegister((DataRegister *)&local_a50,'\x04');
  md::Code::addqb((Code *)local_88,'\x02',&local_a50);
  md::DataRegister::DataRegister(&local_a60,'\x06');
  md::Code::lslw((Code *)local_88,'\x04',&local_a60);
  md::DataRegister::DataRegister(&local_a70,'\x06');
  md::Code::andiw((Code *)local_88,0xff00,(Param *)&local_a70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"repeat",&local_a91);
  md::Code::bra((Code *)local_88,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"init_repeat_small_word",&local_ab9);
  md::Code::label((Code *)local_88,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  md::DataRegister::DataRegister(&local_ad0,'\x06');
  md::DataRegister::DataRegister(&local_ae0,'\x04');
  md::Code::movew((Code *)local_88,(Param *)&local_ad0,(Param *)&local_ae0);
  md::DataRegister::DataRegister(&local_af0,'\x04');
  md::Code::andiw((Code *)local_88,3,(Param *)&local_af0);
  md::DataRegister::DataRegister((DataRegister *)&local_b00,'\x04');
  md::Code::addqb((Code *)local_88,'\x02',&local_b00);
  md::DataRegister::DataRegister(&local_b10,'\x06');
  md::Code::lsrw((Code *)local_88,'\x02',&local_b10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"repeat",&local_b31);
  md::Code::bra((Code *)local_88,&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"unpack_bytes",&local_b59)
  ;
  md::Code::label((Code *)local_88,&local_b58);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  md::DataRegister::DataRegister(&local_b70,'\x06');
  md::DataRegister::DataRegister(&local_b80,'\a');
  md::Code::movew((Code *)local_88,(Param *)&local_b70,(Param *)&local_b80);
  md::DataRegister::DataRegister(&local_b90,'\x06');
  md::Code::lsrw((Code *)local_88,'\x06',&local_b90);
  md::DataRegister::DataRegister(&local_ba0,'\x06');
  md::AddressRegister::AddressRegister(&local_bd0,'\x01');
  addr_postinc_<void>(&local_bc0,&local_bd0);
  md::Code::movew((Code *)local_88,(Param *)&local_ba0,&local_bc0.super_Param);
  md::DataRegister::DataRegister(&local_be0,'\x04');
  md::Code::moveq((Code *)local_88,'\x01',&local_be0);
  md::DataRegister::DataRegister(&local_bf0,'\a');
  md::DataRegister::DataRegister(&local_c00,'\x06');
  md::Code::movew((Code *)local_88,(Param *)&local_bf0,(Param *)&local_c00);
  md::DataRegister::DataRegister(&local_c10,'\x06');
  md::Code::andiw((Code *)local_88,0x3f,(Param *)&local_c10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"next_loop_iteration",&local_c31);
  md::Code::bra((Code *)local_88,&local_c30);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  this = func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"",&local_c59);
  uVar1 = md::ROM::inject_code((ROM *)this,(Code *)local_88,&local_c58);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  md::Code::~Code((Code *)local_88);
  return uVar1;
}

Assistant:

static uint32_t inject_func_load_data_block(md::ROM& rom)
    {
        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A3 });

        func.adda(reg_D1, reg_A1); // advance to first non-empty line
        func.label("line");
        {
            // Store line starting address (A1) inside A3
            func.movel(reg_A1, reg_A3);
            {
                func.adda(reg_D2, reg_A1); // advance to first non-empty word in line
                func.movew(reg_D3, reg_D0); // setup the amount of words to copy inside D0

                // copy D0 words from A0 to A1, or until a 0xFFFF is found
                func.label("loop");
                {
                    // If there are still words to skip, skip it!
                    func.tstw(reg_D5);
                    func.bne("skip");
                    func.tstw(reg_D4);
                    func.bne("repeat");

                    func.movew(addr_postinc_(reg_A0), reg_D7);
                    func.bmi("minus_case");
                    func.movew(reg_D7, addr_postinc_(reg_A1));
                }
                func.label("next_loop_iteration");
                func.dbra(reg_D0, "loop");
            }
            func.movel(reg_A3, reg_A1);
            func.adda(LINE_SIZE_IN_BYTES, reg_A1); // advance to next line start
        }
        func.bra("line");

        func.label("ret");
        func.movem_from_stack({ reg_D0_D7 }, { reg_A3 });
        func.rts();

        // -----------------------------------------------
        // Code block handling the case where we need to skip iterations
        func.label("skip");
        {
            func.subqw(1, reg_D5);
            func.addql(2, reg_A1);
            func.bra("next_loop_iteration");
        }

        // -----------------------------------------------
        // Code block handling the case where we need to repeat data
        func.label("repeat");
        {
            func.subqw(1, reg_D4);
            func.movew(reg_D6, addr_postinc_(reg_A1));
            func.bra("next_loop_iteration");
        }

        // -----------------------------------------------
        // Code block handling the case where the msb is set
        func.label("minus_case");
        {
            func.andiw(0x7FFF, reg_D7); // Remove the topmost bit which is always set
            func.beq("ret");            // "10000000 00000000" case: end of block

            // Split the operand (D7) from the data (D6)
            func.movew(reg_D7, reg_D6);
            func.andiw(0x0FFF, reg_D6);
            func.lsll(4, reg_D7);
            func.clrw(reg_D7);
            func.swap(reg_D7);

            // Branch depending on the operand type
            func.beq("init_skip");                  // 0 --> 68710 usages
            func.cmpib(2, reg_D7);
            func.beq("init_repeat_byte");           // 2 --> 40787 usages
            func.cmpib(1, reg_D7);
            func.beq("unpack_bytes");               // 1 --> 30821 usages
            func.cmpib(5, reg_D7);
            func.beq("init_repeat_inverted_word");  // 5 --> 20744 usages
            func.cmpib(6, reg_D7);
            func.beq("init_repeat_small_word");     // 6 --> 16096 usages
            func.bra("init_repeat_word");           // 3 --> 114 usages
            //func.cmpib(3, reg_D7);
            //func.beq("init_repeat_word");
        }

        // -----------------------------------------------
        // 0 -> "1000AAAA AAAAAAAA" case: skip A words
        func.label("init_skip");
        {
            func.movew(reg_D6, reg_D5);  // Setup the amount of words to skip
            func.bra("skip");            // Start the skipping loop
        }

        // -----------------------------------------------
        // 2 -> "1010AAAA BBBBBBBB" case: repeat A times byte B
        func.label("init_repeat_byte");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.lsrw(8, reg_D4);
            // Setup word to repeat (D6)
            func.andiw(0x00FF, reg_D6);
            func.bra("repeat");            // Start the repeat loop
        }

        // -----------------------------------------------
        // 3 -> "1011AAAA AAAAAAAA" case: repeat next word A times
        func.label("init_repeat_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            // Setup word to repeat (D6)
            func.movew(addr_postinc_(reg_A0), reg_D6);
            func.bra("repeat");            // Start the repeat loop
        }

        // -----------------------------------------------
        // 5 -> "1101BBBB BBBBAAAA" case: repeat A+2 times byte B as an inverted word (0x26 >>> 0x2600)
        func.label("init_repeat_inverted_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.andiw(0x000F, reg_D4);
            func.addqb(2, reg_D4);
            // Setup word to repeat (D6)
            func.lslw(4, reg_D6);
            func.andiw(0xFF00, reg_D6);
            func.bra("repeat");     // Start the repeat loop
        }

        // -----------------------------------------------
        // 6 -> "1110WWWW WWWWWWXX" case: repeat 2+X times small word W
        func.label("init_repeat_small_word");
        {
            // Setup amount of repeats (D4)
            func.movew(reg_D6, reg_D4);
            func.andiw(0x0003, reg_D4);
            func.addqb(2, reg_D4);
            // Setup word to repeat (D6)
            func.lsrw(2, reg_D6);
            func.bra("repeat");     // Start the repeat loop
        }

        // -----------------------------------------------
        // 4 -> "1001AAAA AABBBBBB" case: place byte A then byte B as words
        func.label("unpack_bytes");
        {
            func.movew(reg_D6, reg_D7);
            func.lsrw(6, reg_D6);
            func.movew(reg_D6, addr_postinc_(reg_A1));
            // Setup a 1 occurence repeat to make the whole process handle line changes correctly
            func.moveq(1, reg_D4); // 1 repeat
            func.movew(reg_D7, reg_D6);
            func.andiw(0x003F, reg_D6);
            func.bra("next_loop_iteration");
        }

        return rom.inject_code(func);
    }